

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall
embree::SceneGraph::GridMeshNode::GridMeshNode
          (GridMeshNode *this,Ref<embree::SceneGraph::GridMeshNode> *imesh,Transformations *spaces)

{
  long *plVar1;
  long *in_RSI;
  undefined8 *in_RDI;
  Transformations *in_stack_00000190;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_stack_00000198;
  bool in_stack_ffffffffffffff4f;
  Node *in_stack_ffffffffffffff50;
  vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
  *__x;
  vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
  *this_00;
  
  Node::Node(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4f);
  *in_RDI = &PTR__GridMeshNode_005fe6a8;
  __x = (vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
         *)(in_RDI + 0xd);
  this_00 = (vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
             *)*in_RSI;
  (__x->
  super__Vector_base<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
  )._M_impl.super__Vector_impl_data._M_start =
       this_00[4].
       super__Vector_base<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  transformMSMBlurVec3faBuffer(in_stack_00000198,in_stack_00000190);
  std::
  vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
  ::vector(this_00,__x);
  plVar1 = in_RDI + 0x14;
  *plVar1 = *(long *)(*in_RSI + 0xa0);
  if (*plVar1 != 0) {
    (**(code **)(*(long *)*plVar1 + 0x10))();
  }
  return;
}

Assistant:

GridMeshNode (Ref<SceneGraph::GridMeshNode> imesh, const Transformations& spaces)
        : Node(true),
         time_range(imesh->time_range),
          positions(transformMSMBlurVec3faBuffer(imesh->positions,spaces)),
        grids(imesh->grids), material(imesh->material) {}